

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::AVisitor<hiberlite::UpdateBean>::pushAndSubPrefix
          (AVisitor<hiberlite::UpdateBean> *this,string *prefix)

{
  long lVar1;
  string local_58 [32];
  undefined1 local_38 [40];
  string *prefix_local;
  AVisitor<hiberlite::UpdateBean> *this_local;
  
  local_38._32_8_ = prefix;
  prefix_local = (string *)this;
  std::stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>::
  push(&this->stack,&this->scope);
  Scope::prefix_abi_cxx11_((Scope *)local_38);
  lVar1 = std::__cxx11::string::size();
  std::__cxx11::string::~string((string *)local_38);
  if (lVar1 == 0) {
    std::__cxx11::string::operator+=((string *)&(this->scope)._prefix,(string *)prefix);
  }
  else {
    std::operator+((char *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f6a92);
    std::__cxx11::string::operator+=((string *)&(this->scope)._prefix,local_58);
    std::__cxx11::string::~string(local_58);
  }
  (this->scope).prefix_depth = (this->scope).prefix_depth + 1;
  return;
}

Assistant:

void AVisitor<C>::pushAndSubPrefix(std::string prefix)
{
	stack.push(scope);
	if(scope.prefix().size())
		scope._prefix+="_"+prefix;
	else
		scope._prefix+=prefix;
	scope.prefix_depth++;
}